

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::CuriosityRocker::CuriosityRocker
          (CuriosityRocker *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,int side)

{
  char *local_88;
  ChColor local_58 [2];
  shared_ptr<chrono::ChMaterialSurface> local_40;
  int local_2c;
  shared_ptr<chrono::ChMaterialSurface> *psStack_28;
  int side_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  ChFrame<double> *rel_pos_local;
  string *name_local;
  CuriosityRocker *this_local;
  
  local_2c = side;
  psStack_28 = mat;
  mat_local = (shared_ptr<chrono::ChMaterialSurface> *)rel_pos;
  rel_pos_local = (ChFrame<double> *)name;
  name_local = (string *)this;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_40,mat);
  CuriosityPart::CuriosityPart(&this->super_CuriosityPart,name,rel_pos,&local_40,false);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_40);
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityRocker_002ee990;
  if (local_2c == 0) {
    local_88 = "curiosity_F_L_arm";
  }
  else {
    local_88 = "curiosity_F_R_arm";
  }
  std::__cxx11::string::operator=((string *)&(this->super_CuriosityPart).m_mesh_name,local_88);
  ChColor::ChColor(local_58,1.0,0.4,0.0);
  ChColor::operator=(&(this->super_CuriosityPart).m_color,local_58);
  CuriosityPart::CalcMassProperties(&this->super_CuriosityPart,2000.0);
  return;
}

Assistant:

CuriosityRocker::CuriosityRocker(const std::string& name,
                                 const ChFrame<>& rel_pos,
                                 std::shared_ptr<ChMaterialSurface> mat,
                                 int side)
    : CuriosityPart(name, rel_pos, mat, false) {
    m_mesh_name = (side == 0) ? "curiosity_F_L_arm" : "curiosity_F_R_arm";
    m_color = ChColor(1.0f, 0.4f, 0.0f);

    // Titanium tubing (use an average density)
    CalcMassProperties(2000);
}